

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::shl<unsigned_int>
          (uintwide_t<256U,_unsigned_short,_void,_false> *this,uint n)

{
  ushort uVar1;
  sbyte sVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = 0x10;
  if (n >> 4 < 0x10) {
    uVar5 = n >> 4;
  }
  if (0xf < n) {
    for (lVar4 = 0; (ulong)(uVar5 * 2) - 0x20 != lVar4; lVar4 = lVar4 + -2) {
      *(undefined2 *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar4 + 0x1e) =
           *(undefined2 *)((long)this + lVar4 + (0x1e - (ulong)(uVar5 * 2)));
    }
    for (uVar6 = 0; uVar5 * 2 != uVar6; uVar6 = uVar6 + 2) {
      *(undefined2 *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + uVar6) = 0;
    }
  }
  if ((n & 0xf) != 0) {
    sVar2 = (sbyte)(n & 0xf);
    uVar3 = 0;
    for (uVar6 = (ulong)(uVar5 * 2); uVar6 != 0x20; uVar6 = uVar6 + 2) {
      uVar1 = *(ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + uVar6);
      *(ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + uVar6) =
           uVar1 << sVar2 | uVar3;
      uVar3 = uVar1 >> (0x10U - sVar2 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shl(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto left_shift_amount = static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(offset > static_cast<unsigned_fast_type>(UINT8_C(0)))
      {
        detail::copy_backward_unsafe(values.cbegin(),
                                     detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs - offset)),
                                     detail::advance_and_point(values.begin(), static_cast<size_t>(number_of_limbs)));

        detail::fill_unsafe(values.begin(), detail::advance_and_point(values.begin(), static_cast<size_t>(offset)), static_cast<limb_type>(UINT8_C(0)));
      }

      using local_integral_type = unsigned_fast_type;

      if(left_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value = static_cast<limb_type>(UINT8_C(0));

        auto ai = detail::advance_and_point(values.begin(), offset); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(ai != values.end()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *ai;

          *ai++ =
            static_cast<limb_type>
            (
                static_cast<limb_type>(t << static_cast<local_integral_type>(left_shift_amount))
              | part_from_previous_value
            );

          const auto right_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(left_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t >> right_shift_previous_value);
        }
      }
    }